

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

Item * jbcoin::getTxFormat(TxType type)

{
  Item *pIVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  TxFormats::getInstance();
  pIVar1 = KnownFormats<jbcoin::TxType>::findByType
                     (&TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>,type);
  if (pIVar1 != (Item *)0x0) {
    return pIVar1;
  }
  std::__cxx11::to_string(&local_30,type);
  std::operator+(&local_50,"Invalid transaction type ",&local_30);
  Throw<std::runtime_error,std::__cxx11::string>(&local_50);
}

Assistant:

static
auto getTxFormat (TxType type)
{
    auto format = TxFormats::getInstance().findByType (type);

    if (format == nullptr)
    {
        Throw<std::runtime_error> (
            "Invalid transaction type " +
            std::to_string (
                static_cast<std::underlying_type_t<TxType>>(type)));
    }

    return format;
}